

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memory.h
# Opt level: O2

Own<capnp::_::SegmentBuilder> __thiscall
kj::
heap<capnp::_::SegmentBuilder,capnp::_::BuilderArena*,kj::Id<unsigned_int,capnp::_::Segment>,capnp::word_const*,unsigned_int&,capnp::_::ReadLimiter*>
          (kj *this,BuilderArena **params,Id<unsigned_int,_capnp::_::Segment> *params_1,
          word **params_2,uint *params_3,ReadLimiter **params_4)

{
  uint uVar1;
  uint uVar2;
  word *pwVar3;
  ReadLimiter *pRVar4;
  undefined8 *puVar5;
  Own<capnp::_::SegmentBuilder> OVar6;
  
  puVar5 = (undefined8 *)operator_new(0x38);
  uVar1 = params_1->value;
  pwVar3 = *params_2;
  uVar2 = *params_3;
  pRVar4 = *params_4;
  *puVar5 = *params;
  *(uint *)(puVar5 + 1) = uVar1;
  puVar5[2] = pwVar3;
  puVar5[3] = (ulong)uVar2;
  puVar5[4] = pRVar4;
  puVar5[5] = pwVar3 + uVar2;
  *(undefined1 *)(puVar5 + 6) = 1;
  *(undefined8 **)this = &_::HeapDisposer<capnp::_::SegmentBuilder>::instance;
  *(undefined8 **)(this + 8) = puVar5;
  OVar6.ptr._0_4_ = uVar1;
  OVar6.disposer = (Disposer *)this;
  OVar6.ptr._4_4_ = 0;
  return OVar6;
}

Assistant:

Own<T> heap(Params&&... params) {
  // heap<T>(...) allocates a T on the heap, forwarding the parameters to its constructor.  The
  // exact heap implementation is unspecified -- for now it is operator new, but you should not
  // assume this.  (Since we know the object size at delete time, we could actually implement an
  // allocator that is more efficient than operator new.)

  return Own<T>(new T(kj::fwd<Params>(params)...), _::HeapDisposer<T>::instance);
}